

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O1

void __thiscall FunctionSymbol::~FunctionSymbol(FunctionSymbol *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR__FunctionSymbol_001f4628;
  p_Var4 = (this->arguments_).super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->arguments_) {
    p_Var2 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

FunctionSymbol(const std::string& name, const TypeName& returnType, 
    const std::list<TypeName>& arguments):
      name_(name), returnType_(returnType), arguments_(arguments) {}